

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.h
# Opt level: O0

void __thiscall EncodeRelocAndLabels::setLabelCurrPC(EncodeRelocAndLabels *this,BYTE *pc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *this_00;
  BYTE *pc_local;
  EncodeRelocAndLabels *this_local;
  
  bVar2 = isLabel(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.h"
                       ,0x81,"(isLabel())","isLabel()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = getLabel(this);
  IR::LabelInstr::SetPC(this_00,pc);
  return;
}

Assistant:

void    setLabelCurrPC(BYTE* pc)
    {
        Assert(isLabel());
        getLabel()->SetPC(pc);
    }